

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::BuildMacContentDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *base,string *config,
          bool contentOnly)

{
  bool bVar1;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_2a;
  byte local_29;
  string *psStack_28;
  bool contentOnly_local;
  string *config_local;
  string *base_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_2a = 0;
  local_29 = contentOnly;
  psStack_28 = config;
  config_local = base;
  base_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)base);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    GetAppBundleDirectory(&local_60,this,psStack_28,(bool)(local_29 & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  bVar1 = IsFrameworkOnApple(this);
  if (bVar1) {
    GetFrameworkDirectory(&local_80,this,psStack_28,(bool)(local_29 & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  bVar1 = IsCFBundleOnApple(this);
  if (bVar1) {
    GetCFBundleDirectory(&local_a0,this,psStack_28,(bool)(local_29 & 1));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::BuildMacContentDirectory(const std::string& base,
                                            const std::string& config,
                                            bool contentOnly) const
{
  std::string fpath = base;
  if(this->IsAppBundleOnApple())
    {
    fpath += this->GetAppBundleDirectory(config, contentOnly);
    }
  if(this->IsFrameworkOnApple())
    {
    fpath += this->GetFrameworkDirectory(config, contentOnly);
    }
  if(this->IsCFBundleOnApple())
    {
    fpath += this->GetCFBundleDirectory(config, contentOnly);
    }
  return fpath;
}